

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O1

void __thiscall flatbuffers::FlatBufferBuilderImpl<false>::Clear(FlatBufferBuilderImpl<false> *this)

{
  uint8_t **ppuVar1;
  _Rb_tree_header *p_Var2;
  uint8_t *puVar3;
  _Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
  *this_00;
  uint8_t *puVar4;
  
  ppuVar1 = &(this->buf_).scratch_;
  *ppuVar1 = *ppuVar1 + (ulong)this->num_field_loc * -8;
  this->num_field_loc = 0;
  this->max_voffset_ = 0;
  puVar3 = (this->buf_).buf_;
  if (puVar3 == (uint8_t *)0x0) {
    (this->buf_).reserved_ = 0;
    puVar4 = (uint8_t *)0x0;
  }
  else {
    puVar4 = puVar3 + (this->buf_).reserved_;
  }
  (this->buf_).cur_ = puVar4;
  (this->buf_).size_ = 0;
  (this->buf_).scratch_ = puVar3;
  this->nested = false;
  this->finished = false;
  this->minalign_ = 1;
  this->length_of_64_bit_region_ = 0;
  this_00 = &this->string_pool->_M_t;
  if (this_00 ==
      (_Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
       *)0x0) {
    return;
  }
  std::
  _Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
  ::_M_erase(this_00,(_Link_type)(this_00->_M_impl).super__Rb_tree_header._M_header._M_parent);
  p_Var2 = &(this_00->_M_impl).super__Rb_tree_header;
  (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->_M_impl).super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this_00->_M_impl).super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this_00->_M_impl).super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

void ClearOffsets() {
    buf_.scratch_pop(num_field_loc * sizeof(FieldLoc));
    num_field_loc = 0;
    max_voffset_ = 0;
  }